

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_reserve_failure_biggerThanMaxCapacity_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t *psVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  size_t local_30;
  size_t local_28;
  undefined8 *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10b657;
  local_20 = (undefined8 *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  *local_20 = 0x3035353535353535;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x10b687;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,0x21,false,1);
  if (bVar1 != false) {
    local_68 = (size_t)bVar1;
    psVar4 = &local_68;
    local_60 = "false";
    pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar6 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 1, false, sizeof(*(&array)->buffer)) == false"
    ;
    pcVar7 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 1, false, sizeof(*(&array)->buffer))"
    ;
    iVar5 = 0x10c;
    goto LAB_0010b980;
  }
  uStack_50 = 0x10b6a0;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x10c);
  if (local_30 == 8) {
    uStack_50 = 0x10b6c0;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x10d);
    if (local_28 == 8) {
      uStack_50 = 0x10b6e0;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x10e);
      if (local_20 == (undefined8 *)0x0) {
        psVar4 = &local_58;
        pcVar3 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar6 = "(void*) array.buffer != NULL";
        pcVar7 = "(void*) array.buffer";
        iVar5 = 0x10f;
LAB_0010b980:
        uStack_50 = 0;
        local_58 = 0;
        *(code **)((long)psVar4 + -8) = test_ADynArray_reserve_failure_noMemoryAvailable_fn;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar5,pcVar3,pcVar2,pcVar6,pcVar7);
      }
      uStack_50 = 0x10b700;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x10f);
      lVar9 = 0;
      do {
        sVar8 = (size_t)*(char *)((long)local_20 + lVar9);
        if (sVar8 != 0x35) {
          local_60 = "\'5\'";
          pcVar6 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar2 = "array.buffer[i] == \'5\'";
          pcVar3 = "array.buffer[i]";
          iVar5 = 0x111;
          local_58 = 0x35;
          goto LAB_0010b7d6;
        }
        uStack_50 = 0x10b724;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x111);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 7);
      sVar8 = (size_t)*(char *)((long)local_20 + 7);
      if (sVar8 == 0x30) {
        uStack_50 = 0x10b752;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x112);
        if (local_38 == (code *)0x0) {
          psVar4 = &local_58;
          pcVar3 = "Assertion \'_ck_x != NULL\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %#x";
          pcVar6 = "(void*) array.growStrategy != NULL";
          pcVar7 = "(void*) array.growStrategy";
          iVar5 = 0x113;
        }
        else {
          uStack_50 = 0x10b76f;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x113);
          if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
            uStack_50 = 0x10b790;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x114);
            uStack_50 = 0x10b799;
            (*pcStack_40)(local_20);
            return;
          }
          psVar4 = &local_68;
          local_60 = "0";
          local_68 = private_ACUtilsTest_ADynArray_reallocCount;
          pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
          pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
          iVar5 = 0x114;
        }
        goto LAB_0010b980;
      }
      local_60 = "\'0\'";
      pcVar6 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
      pcVar2 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
      pcVar3 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
      iVar5 = 0x112;
      local_58 = 0x30;
      goto LAB_0010b7d6;
    }
    pcVar2 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
    pcVar3 = "array.capacity";
    iVar5 = 0x10e;
    sVar8 = local_28;
  }
  else {
    pcVar2 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
    pcVar3 = "array.size";
    iVar5 = 0x10d;
    sVar8 = local_30;
  }
  local_60 = "private_ACUtilsTest_ADynArray_capacityMin";
  pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  local_58 = 8;
LAB_0010b7d6:
  uStack_50 = 0;
  local_68 = sVar8;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar5,"Assertion \'_ck_x == _ck_y\' failed",pcVar6,pcVar2,pcVar3);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_biggerThanMaxCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 1), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}